

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

int __thiscall ninx::lexer::Reader::get_next_limiter(Reader *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  while( true ) {
    iVar2 = std::istream::peek();
    if (iVar2 < 0) {
      return -1;
    }
    if (iVar2 != 0x2f) break;
    bVar1 = ignore_comment(this);
    if (!bVar1) {
LAB_0012ca4e:
      bVar1 = is_limiter((char)iVar2);
      iVar3 = -2;
      if (bVar1) {
        std::istream::get();
        if (iVar2 == 0x3d) {
          ignore_spaces(this);
          iVar3 = 0x3d;
        }
        else if (iVar2 == 0x7d) {
          ignore_spaces(this);
          iVar3 = 0x7d;
        }
        else {
          iVar3 = iVar2;
          if (iVar2 == 0x7b) {
            ignore_spaces_and_newline(this);
            iVar3 = 0x7b;
          }
        }
      }
      return iVar3;
    }
  }
  if (iVar2 == 0x5c) {
    return -2;
  }
  if (iVar2 == 0x2d) {
    std::istream::get();
    iVar2 = std::istream::peek();
    if (9 < iVar2 - 0x30U) {
      ignore_spaces(this);
      return 0x2d;
    }
    std::istream::seekg((long)this->stream,~_S_beg);
    return -2;
  }
  goto LAB_0012ca4e;
}

Assistant:

int ninx::lexer::Reader::get_next_limiter() {
    int next_char = this->stream.peek();
    if (next_char >= 0) {
        if (next_char == '\\') {  // Escape char check
            return FOUND_TEXT;
        }else{
            if(next_char == '-') {  // Negative number handling
                this->stream.get();

                // Check if the next entry is a digit
                if (isdigit(this->stream.peek())) {
                    this->stream.seekg(-1, std::ios_base::cur);
                    return FOUND_TEXT;
                }

                // Also ignore the trailing spaces
                this->ignore_spaces();

                return next_char;
            }

            if (next_char == '/') {  // Comments handling
                bool comments_ignored { this->ignore_comment() };
                if (comments_ignored) {
                    return this->get_next_limiter();
                }
            }

            // Check if the char is a limiter
            if (is_limiter(static_cast<char>(next_char))) {
                // If the char is a limiter, consume it
                this->stream.get();

                // Also ignore the trailing spaces
                // Check if it is the beginning of a block, in that case remove also the new lines
                if (next_char == '{') {
                    this->ignore_spaces_and_newline();
                }else if (next_char == '}') {
                    this->ignore_spaces();
                }else if (next_char == '='){
                    this->ignore_spaces();
                }

                return next_char;
            }else{
                return FOUND_TEXT;
            }
        }
    }else{  // EOF
        return FOUND_EOF;
    }
}